

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.c
# Opt level: O2

_Bool lrtr_ip_str_cmp(lrtr_ip_addr *addr1,char *addr2)

{
  lrtr_ip_addr a;
  lrtr_ip_addr b;
  _Bool _Var1;
  int iVar2;
  long in_FS_OFFSET;
  lrtr_ip_addr tmp;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb4;
  lrtr_ip_addr local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = lrtr_ip_str_to_addr(addr2,&local_28);
  if (iVar2 == -1) {
    _Var1 = false;
  }
  else {
    a.u.addr6.addr[2] = in_stack_ffffffffffffff9c;
    a._0_12_ = *(undefined1 (*) [12])((long)&addr1->u + 4);
    a.u.addr6.addr[3] = local_28.ver;
    b.u.addr6.addr[1] = local_28.u.addr6.addr[3];
    b._0_8_ = local_28.u._4_8_;
    b.u.addr6.addr[2] = in_stack_ffffffffffffffb4;
    b.u.addr6.addr[3] = (int)*(undefined8 *)addr1;
    _Var1 = lrtr_ip_addr_equal(a,b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return _Var1;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT bool lrtr_ip_str_cmp(const struct lrtr_ip_addr *addr1, const char *addr2)
{
	struct lrtr_ip_addr tmp;

	if (lrtr_ip_str_to_addr(addr2, &tmp) == -1)
		return false;
	return lrtr_ip_addr_equal(*addr1, tmp);
}